

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::MergeFromInternal
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other,
          offset_in_RepeatedPtrFieldBase_to_subr inner_loop)

{
  Rep *pRVar1;
  void **ppvVar2;
  long in_RCX;
  int iVar3;
  long *plVar4;
  
  iVar3 = other->current_size_;
  pRVar1 = other->rep_;
  ppvVar2 = InternalExtend(this,iVar3);
  plVar4 = (long *)((long)&this->arena_ + in_RCX);
  if ((inner_loop & 1) != 0) {
    inner_loop = *(undefined8 *)(*plVar4 + -1 + inner_loop);
  }
  (*(code *)inner_loop)
            (plVar4,ppvVar2,pRVar1->elements,iVar3,this->rep_->allocated_size - this->current_size_)
  ;
  iVar3 = iVar3 + this->current_size_;
  this->current_size_ = iVar3;
  if (this->rep_->allocated_size < iVar3) {
    this->rep_->allocated_size = iVar3;
  }
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::MergeFromInternal(
    const RepeatedPtrFieldBase& other,
    void (RepeatedPtrFieldBase::*inner_loop)(void**, void**, int, int)) {
  // Note: wrapper has already guaranteed that other.rep_ != NULL here.
  int other_size = other.current_size_;
  void** other_elements = other.rep_->elements;
  void** new_elements = InternalExtend(other_size);
  int allocated_elems = rep_->allocated_size - current_size_;
  (this->*inner_loop)(new_elements, other_elements, other_size,
                      allocated_elems);
  current_size_ += other_size;
  if (rep_->allocated_size < current_size_) {
    rep_->allocated_size = current_size_;
  }
}